

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

DescriptorScriptPubKeyMan * __thiscall
wallet::CWallet::LoadDescriptorScriptPubKeyMan(CWallet *this,uint256 id,WalletDescriptor *desc)

{
  ulong uVar1;
  DescriptorScriptPubKeyMan *this_00;
  long in_FS_OFFSET;
  DescriptorScriptPubKeyMan *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i;
  this_00 = (DescriptorScriptPubKeyMan *)operator_new(0x278);
  if ((uVar1 >> 0x23 & 1) == 0) {
    DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
              (this_00,&this->super_WalletStorage,desc,this->m_keypool_size);
  }
  else {
    DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
              (this_00,&this->super_WalletStorage,desc,this->m_keypool_size);
    (this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan =
         (_func_int **)&PTR__DescriptorScriptPubKeyMan_00b3d1a8;
  }
  local_30 = this_00;
  AddScriptPubKeyMan(this,&id,(unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                               )&local_30);
  if (local_30 != (DescriptorScriptPubKeyMan *)0x0) {
    (*(local_30->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[1])();
  }
  local_30 = (DescriptorScriptPubKeyMan *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

DescriptorScriptPubKeyMan& CWallet::LoadDescriptorScriptPubKeyMan(uint256 id, WalletDescriptor& desc)
{
    DescriptorScriptPubKeyMan* spk_manager;
    if (IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
        spk_manager = new ExternalSignerScriptPubKeyMan(*this, desc, m_keypool_size);
    } else {
        spk_manager = new DescriptorScriptPubKeyMan(*this, desc, m_keypool_size);
    }
    AddScriptPubKeyMan(id, std::unique_ptr<ScriptPubKeyMan>(spk_manager));
    return *spk_manager;
}